

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

void __thiscall
biosoup::Sequence::Sequence(Sequence *this,string *name,string *data,string *quality)

{
  Sequence(this,(name->_M_dataplus)._M_p,(uint32_t)name->_M_string_length,(data->_M_dataplus)._M_p,
           (uint32_t)data->_M_string_length,(quality->_M_dataplus)._M_p,
           (uint32_t)quality->_M_string_length);
  return;
}

Assistant:

Sequence(
      const std::string& name,
      const std::string& data,
      const std::string& quality)
      : Sequence(
          name.c_str(), name.size(),
          data.c_str(), data.size(),
          quality.c_str(), quality.size()) {}